

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
::occludedCoherent(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                   *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 in_EAX;
  uint uVar15;
  int iVar16;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar17;
  code *pcVar19;
  ulong uVar20;
  ulong uVar21;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar22;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar23;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar24;
  undefined4 uVar25;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar26;
  ulong uVar27;
  size_t sVar28;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar29;
  ulong uVar30;
  uint uVar56;
  uint uVar57;
  vint4 bi_2;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar58;
  uint uVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar60;
  uint uVar61;
  uint uVar62;
  float fVar69;
  float fVar72;
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar70;
  uint uVar71;
  uint uVar73;
  uint uVar74;
  float fVar75;
  uint uVar76;
  uint uVar77;
  float fVar78;
  undefined1 auVar68 [16];
  uint uVar79;
  float fVar80;
  float fVar93;
  uint uVar96;
  vint4 ai_1;
  float fVar98;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar94;
  float fVar95;
  float fVar97;
  uint uVar99;
  float fVar100;
  undefined1 auVar92 [16];
  float fVar101;
  float fVar109;
  float fVar110;
  vint4 ai_3;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar111;
  float fVar112;
  float fVar115;
  float fVar116;
  float fVar117;
  vint4 ai_5;
  float fVar118;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  vint4 bi_4;
  float fVar126;
  vint4 bi_3;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined4 uVar132;
  vint4 ai_4;
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  vint<4> octant;
  vint4 bi_9;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  undefined1 local_1158 [16];
  vint<4> *local_1140;
  undefined8 local_1138;
  undefined4 local_1130;
  StackItemMaskT<embree::NodeRefPtr<4>_> *local_1128;
  Intersectors *local_1120;
  undefined4 local_1118;
  uint local_1114;
  long local_1110;
  undefined8 local_1108;
  long local_1100;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  uint local_1068;
  uint uStack_1064;
  uint uStack_1060;
  uint uStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
  *pBVar18;
  
  auVar134._0_4_ = -(uint)(*(int *)this == -1);
  auVar134._4_4_ = -(uint)(*(int *)(this + 4) == -1);
  auVar134._8_4_ = -(uint)(*(int *)(this + 8) == -1);
  auVar134._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
  uVar15 = movmskps(in_EAX,auVar134);
  if (uVar15 == 0) {
    return;
  }
  local_10f8 = *(int *)this;
  iStack_10f4 = *(int *)(this + 4);
  iStack_10f0 = *(int *)(this + 8);
  iStack_10ec = *(int *)(this + 0xc);
  lVar2 = (valid_i->field_0).v[0];
  fVar135 = *(float *)&This->ptr;
  fVar136 = *(float *)((long)&This->ptr + 4);
  fVar137 = *(float *)&This->leafIntersector;
  fVar138 = *(float *)((long)&This->leafIntersector + 4);
  fVar139 = *(float *)&(This->collider).collide;
  fVar140 = *(float *)((long)&(This->collider).collide + 4);
  fVar141 = *(float *)&(This->collider).name;
  fVar142 = *(float *)((long)&(This->collider).name + 4);
  auVar64._0_8_ = (This->intersector4).intersect;
  auVar64._8_8_ = (This->intersector4).occluded;
  fVar93 = (float)((ulong)auVar64._0_8_ >> 0x20);
  fVar98 = (float)((ulong)auVar64._8_8_ >> 0x20);
  fVar120 = (float)DAT_01f4bd50;
  fVar122 = DAT_01f4bd50._4_4_;
  fVar124 = DAT_01f4bd50._8_4_;
  fVar126 = DAT_01f4bd50._12_4_;
  auVar82._4_4_ = -(uint)(ABS(fVar93) < fVar122);
  auVar82._0_4_ = -(uint)(ABS((float)auVar64._0_8_) < fVar120);
  auVar82._8_4_ = -(uint)(ABS((float)auVar64._8_8_) < fVar124);
  auVar82._12_4_ = -(uint)(ABS(fVar98) < fVar126);
  auVar127 = blendvps(auVar64,_DAT_01f4bd50,auVar82);
  auVar82 = *(undefined1 (*) [16])&(This->intersector4).name;
  auVar131._4_4_ = -(uint)(ABS(auVar82._4_4_) < fVar122);
  auVar131._0_4_ = -(uint)(ABS(auVar82._0_4_) < fVar120);
  auVar131._8_4_ = -(uint)(ABS(auVar82._8_4_) < fVar124);
  auVar131._12_4_ = -(uint)(ABS(auVar82._12_4_) < fVar126);
  auVar131 = blendvps(auVar82,_DAT_01f4bd50,auVar131);
  fVar143 = *(float *)&(This->intersector1).intersect;
  fVar144 = *(float *)((long)&(This->intersector1).intersect + 4);
  fVar145 = *(float *)&(This->intersector1).occluded;
  fVar146 = *(float *)((long)&(This->intersector1).occluded + 4);
  auVar86._0_8_ = (This->intersector4_filter).occluded;
  auVar86._8_8_ = (This->intersector4_filter).name;
  fVar115 = (float)((ulong)auVar86._0_8_ >> 0x20);
  fVar118 = (float)((ulong)auVar86._8_8_ >> 0x20);
  auVar108._4_4_ = -(uint)(ABS(fVar115) < fVar122);
  auVar108._0_4_ = -(uint)(ABS((float)auVar86._0_8_) < fVar120);
  auVar108._8_4_ = -(uint)(ABS((float)auVar86._8_8_) < fVar124);
  auVar108._12_4_ = -(uint)(ABS(fVar118) < fVar126);
  auVar133 = blendvps(auVar86,_DAT_01f4bd50,auVar108);
  auVar63._0_8_ = (This->intersector1).pointQuery;
  auVar63._8_8_ = (This->intersector1).name;
  auVar31 = rcpps(auVar108,auVar127);
  fVar147 = auVar31._0_4_;
  fVar148 = auVar31._4_4_;
  fVar149 = auVar31._8_4_;
  fVar150 = auVar31._12_4_;
  fVar147 = (1.0 - auVar127._0_4_ * fVar147) * fVar147 + fVar147;
  fVar148 = (1.0 - auVar127._4_4_ * fVar148) * fVar148 + fVar148;
  fVar149 = (1.0 - auVar127._8_4_ * fVar149) * fVar149 + fVar149;
  fVar150 = (1.0 - auVar127._12_4_ * fVar150) * fVar150 + fVar150;
  auVar31 = rcpps(auVar31,auVar131);
  fVar120 = auVar31._0_4_;
  fVar122 = auVar31._4_4_;
  fVar124 = auVar31._8_4_;
  fVar126 = auVar31._12_4_;
  local_10d8._0_8_ =
       CONCAT44((1.0 - auVar131._4_4_ * fVar122) * fVar122 + fVar122,
                (1.0 - auVar131._0_4_ * fVar120) * fVar120 + fVar120);
  local_10d8._8_4_ = (1.0 - auVar131._8_4_ * fVar124) * fVar124 + fVar124;
  local_10d8._12_4_ = (1.0 - auVar131._12_4_ * fVar126) * fVar126 + fVar126;
  auVar31 = rcpps(auVar31,auVar133);
  fVar120 = auVar31._0_4_;
  fVar122 = auVar31._4_4_;
  fVar124 = auVar31._8_4_;
  fVar126 = auVar31._12_4_;
  auVar127._8_4_ = local_10d8._8_4_;
  auVar127._0_8_ = local_10d8._0_8_;
  auVar127._12_4_ = local_10d8._12_4_;
  fVar120 = (1.0 - auVar133._0_4_ * fVar120) * fVar120 + fVar120;
  fVar122 = (1.0 - auVar133._4_4_ * fVar122) * fVar122 + fVar122;
  fVar124 = (1.0 - auVar133._8_4_ * fVar124) * fVar124 + fVar124;
  fVar126 = (1.0 - auVar133._12_4_ * fVar126) * fVar126 + fVar126;
  auVar133._0_12_ = ZEXT812(0);
  auVar133._12_4_ = 0;
  auVar63 = maxps(auVar63,auVar133);
  local_10e8 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar133);
  auVar31._8_4_ = 0xffffffff;
  auVar31._0_8_ = 0xffffffffffffffff;
  auVar31._12_4_ = 0xffffffff;
  auVar134 = auVar134 ^ auVar31;
  auVar129._0_8_ = CONCAT44(-(uint)(fVar93 < 0.0),-(uint)((float)auVar64._0_8_ < 0.0)) & 0x100000001
  ;
  auVar129._8_4_ = -(uint)((float)auVar64._8_8_ < 0.0) & 1;
  auVar129._12_4_ = -(uint)(fVar98 < 0.0) & 1;
  auVar102._0_8_ = CONCAT44(-(uint)(auVar82._4_4_ < 0.0),-(uint)(auVar82._0_4_ < 0.0)) & 0x200000002
  ;
  auVar102._8_4_ = -(uint)(auVar82._8_4_ < 0.0) & 2;
  auVar102._12_4_ = -(uint)(auVar82._12_4_ < 0.0) & 2;
  auVar113._0_8_ =
       CONCAT44(-(uint)(fVar115 < 0.0),-(uint)((float)auVar86._0_8_ < 0.0)) & 0x400000004;
  auVar113._8_4_ = -(uint)((float)auVar86._8_8_ < 0.0) & 4;
  auVar113._12_4_ = -(uint)(fVar118 < 0.0) & 4;
  local_1158 = auVar113 | auVar134 | auVar102 | auVar129;
  _local_1068 = mm_lookupmask_ps._0_8_;
  _uStack_1060 = mm_lookupmask_ps._8_8_;
  local_1088 = fVar135;
  fStack_1084 = fVar136;
  fStack_1080 = fVar137;
  fStack_107c = fVar138;
  local_1098 = fVar139;
  fStack_1094 = fVar140;
  fStack_1090 = fVar141;
  fStack_108c = fVar142;
  local_10a8 = fVar143;
  fStack_10a4 = fVar144;
  fStack_10a0 = fVar145;
  fStack_109c = fVar146;
  local_10b8 = fVar120;
  fStack_10b4 = fVar122;
  fStack_10b0 = fVar124;
  fStack_10ac = fVar126;
  local_10c8 = fVar147;
  fStack_10c4 = fVar148;
  fStack_10c0 = fVar149;
  fStack_10bc = fVar150;
  pBVar18 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
             *)(ulong)(uVar15 & 0xff);
LAB_0073094a:
  lVar3 = 0;
  if (pBVar18 !=
      (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
       *)0x0) {
    for (; ((ulong)pBVar18 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
    }
  }
  iVar16 = *(int *)(local_1158 + lVar3 * 4);
  auVar32._0_8_ = CONCAT44(-(uint)(iVar16 == local_1158._4_4_),-(uint)(iVar16 == local_1158._0_4_));
  auVar32._8_4_ = -(uint)(iVar16 == local_1158._8_4_);
  auVar32._12_4_ = -(uint)(iVar16 == local_1158._12_4_);
  uVar25 = movmskps((int)this,auVar32);
  stack[0].mask = CONCAT44((int)((ulong)this >> 0x20),uVar25);
  stack[0].ptr.ptr = *(size_t *)(lVar2 + 0x70);
  pBVar26 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
             *)(~stack[0].mask & (ulong)pBVar18);
  auVar5._4_4_ = fVar136;
  auVar5._0_4_ = fVar135;
  auVar5._8_4_ = fVar137;
  auVar5._12_4_ = fVar138;
  auVar64 = blendvps(_DAT_01f45a30,auVar5,auVar32);
  auVar81._4_4_ = auVar64._0_4_;
  auVar81._0_4_ = auVar64._4_4_;
  auVar81._8_4_ = auVar64._12_4_;
  auVar81._12_4_ = auVar64._8_4_;
  auVar64 = minps(auVar81,auVar64);
  auVar65._0_8_ = auVar64._8_8_;
  auVar65._8_4_ = auVar64._0_4_;
  auVar65._12_4_ = auVar64._4_4_;
  auVar64 = minps(auVar65,auVar64);
  auVar7._4_4_ = fVar140;
  auVar7._0_4_ = fVar139;
  auVar7._8_4_ = fVar141;
  auVar7._12_4_ = fVar142;
  auVar82 = blendvps(_DAT_01f45a30,auVar7,auVar32);
  auVar103._4_4_ = auVar82._0_4_;
  auVar103._0_4_ = auVar82._4_4_;
  auVar103._8_4_ = auVar82._12_4_;
  auVar103._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar103,auVar82);
  auVar83._0_8_ = auVar82._8_8_;
  auVar83._8_4_ = auVar82._0_4_;
  auVar83._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar83,auVar82);
  auVar64 = insertps(auVar64,auVar82,0x1c);
  auVar9._4_4_ = fVar144;
  auVar9._0_4_ = fVar143;
  auVar9._8_4_ = fVar145;
  auVar9._12_4_ = fVar146;
  auVar82 = blendvps(_DAT_01f45a30,auVar9,auVar32);
  auVar104._4_4_ = auVar82._0_4_;
  auVar104._0_4_ = auVar82._4_4_;
  auVar104._8_4_ = auVar82._12_4_;
  auVar104._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar104,auVar82);
  auVar84._0_8_ = auVar82._8_8_;
  auVar84._8_4_ = auVar82._0_4_;
  auVar84._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar84,auVar82);
  auVar82 = insertps(auVar64,auVar82,0x20);
  auVar6._4_4_ = fVar136;
  auVar6._0_4_ = fVar135;
  auVar6._8_4_ = fVar137;
  auVar6._12_4_ = fVar138;
  auVar64 = blendvps(_DAT_01f45a40,auVar6,auVar32);
  auVar105._4_4_ = auVar64._0_4_;
  auVar105._0_4_ = auVar64._4_4_;
  auVar105._8_4_ = auVar64._12_4_;
  auVar105._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar105,auVar64);
  auVar85._0_8_ = auVar64._8_8_;
  auVar85._8_4_ = auVar64._0_4_;
  auVar85._12_4_ = auVar64._4_4_;
  auVar86 = maxps(auVar85,auVar64);
  local_11d8._8_4_ = auVar32._8_4_;
  local_11d8._0_8_ = auVar32._0_8_;
  local_11d8._12_4_ = auVar32._12_4_;
  auVar8._4_4_ = fVar140;
  auVar8._0_4_ = fVar139;
  auVar8._8_4_ = fVar141;
  auVar8._12_4_ = fVar142;
  auVar64 = blendvps(_DAT_01f45a40,auVar8,auVar32);
  auVar33._4_4_ = auVar64._0_4_;
  auVar33._0_4_ = auVar64._4_4_;
  auVar33._8_4_ = auVar64._12_4_;
  auVar33._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar33,auVar64);
  auVar87._0_8_ = auVar64._8_8_;
  auVar87._8_4_ = auVar64._0_4_;
  auVar87._12_4_ = auVar64._4_4_;
  auVar64 = maxps(auVar87,auVar64);
  auVar86 = insertps(auVar86,auVar64,0x1c);
  auVar34._8_4_ = auVar32._8_4_;
  auVar34._0_8_ = auVar32._0_8_;
  auVar34._12_4_ = auVar32._12_4_;
  auVar10._4_4_ = fVar144;
  auVar10._0_4_ = fVar143;
  auVar10._8_4_ = fVar145;
  auVar10._12_4_ = fVar146;
  auVar64 = blendvps(_DAT_01f45a40,auVar10,auVar34);
  auVar35._4_4_ = auVar64._0_4_;
  auVar35._0_4_ = auVar64._4_4_;
  auVar35._8_4_ = auVar64._12_4_;
  auVar35._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar35,auVar64);
  auVar88._0_8_ = auVar64._8_8_;
  auVar88._8_4_ = auVar64._0_4_;
  auVar88._12_4_ = auVar64._4_4_;
  auVar64 = maxps(auVar88,auVar64);
  auVar131 = insertps(auVar86,auVar64,0x20);
  auVar36._8_4_ = auVar32._8_4_;
  auVar36._0_8_ = auVar32._0_8_;
  auVar36._12_4_ = auVar32._12_4_;
  auVar13._4_4_ = fVar148;
  auVar13._0_4_ = fVar147;
  auVar13._8_4_ = fVar149;
  auVar13._12_4_ = fVar150;
  auVar64 = blendvps(_DAT_01f45a30,auVar13,auVar36);
  auVar37._4_4_ = auVar64._0_4_;
  auVar37._0_4_ = auVar64._4_4_;
  auVar37._8_4_ = auVar64._12_4_;
  auVar37._12_4_ = auVar64._8_4_;
  auVar64 = minps(auVar37,auVar64);
  auVar128._0_8_ = auVar64._8_8_;
  auVar128._8_4_ = auVar64._0_4_;
  auVar128._12_4_ = auVar64._4_4_;
  auVar86 = minps(auVar128,auVar64);
  auVar38._8_4_ = auVar32._8_4_;
  auVar38._0_8_ = auVar32._0_8_;
  auVar38._12_4_ = auVar32._12_4_;
  auVar64 = blendvps(_DAT_01f45a30,auVar127,auVar38);
  auVar39._4_4_ = auVar64._0_4_;
  auVar39._0_4_ = auVar64._4_4_;
  auVar39._8_4_ = auVar64._12_4_;
  auVar39._12_4_ = auVar64._8_4_;
  auVar64 = minps(auVar39,auVar64);
  auVar89._0_8_ = auVar64._8_8_;
  auVar89._8_4_ = auVar64._0_4_;
  auVar89._12_4_ = auVar64._4_4_;
  auVar64 = minps(auVar89,auVar64);
  auVar86 = insertps(auVar86,auVar64,0x1c);
  auVar40._8_4_ = auVar32._8_4_;
  auVar40._0_8_ = auVar32._0_8_;
  auVar40._12_4_ = auVar32._12_4_;
  auVar11._4_4_ = fVar122;
  auVar11._0_4_ = fVar120;
  auVar11._8_4_ = fVar124;
  auVar11._12_4_ = fVar126;
  auVar64 = blendvps(_DAT_01f45a30,auVar11,auVar40);
  auVar41._4_4_ = auVar64._0_4_;
  auVar41._0_4_ = auVar64._4_4_;
  auVar41._8_4_ = auVar64._12_4_;
  auVar41._12_4_ = auVar64._8_4_;
  auVar64 = minps(auVar41,auVar64);
  auVar90._0_8_ = auVar64._8_8_;
  auVar90._8_4_ = auVar64._0_4_;
  auVar90._12_4_ = auVar64._4_4_;
  auVar64 = minps(auVar90,auVar64);
  auVar129 = insertps(auVar86,auVar64,0x20);
  auVar42._8_4_ = auVar32._8_4_;
  auVar42._0_8_ = auVar32._0_8_;
  auVar42._12_4_ = auVar32._12_4_;
  auVar14._4_4_ = fVar148;
  auVar14._0_4_ = fVar147;
  auVar14._8_4_ = fVar149;
  auVar14._12_4_ = fVar150;
  auVar64 = blendvps(_DAT_01f45a40,auVar14,auVar42);
  auVar43._4_4_ = auVar64._0_4_;
  auVar43._0_4_ = auVar64._4_4_;
  auVar43._8_4_ = auVar64._12_4_;
  auVar43._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar43,auVar64);
  auVar114._0_8_ = auVar64._8_8_;
  auVar114._8_4_ = auVar64._0_4_;
  auVar114._12_4_ = auVar64._4_4_;
  auVar86 = maxps(auVar114,auVar64);
  auVar44._8_4_ = auVar32._8_4_;
  auVar44._0_8_ = auVar32._0_8_;
  auVar44._12_4_ = auVar32._12_4_;
  auVar64 = blendvps(_DAT_01f45a40,auVar127,auVar44);
  auVar45._4_4_ = auVar64._0_4_;
  auVar45._0_4_ = auVar64._4_4_;
  auVar45._8_4_ = auVar64._12_4_;
  auVar45._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar45,auVar64);
  auVar106._0_8_ = auVar64._8_8_;
  auVar106._8_4_ = auVar64._0_4_;
  auVar106._12_4_ = auVar64._4_4_;
  auVar64 = maxps(auVar106,auVar64);
  auVar86 = insertps(auVar86,auVar64,0x1c);
  auVar46._8_4_ = auVar32._8_4_;
  auVar46._0_8_ = auVar32._0_8_;
  auVar46._12_4_ = auVar32._12_4_;
  auVar12._4_4_ = fVar122;
  auVar12._0_4_ = fVar120;
  auVar12._8_4_ = fVar124;
  auVar12._12_4_ = fVar126;
  auVar64 = blendvps(_DAT_01f45a40,auVar12,auVar46);
  auVar47._4_4_ = auVar64._0_4_;
  auVar47._0_4_ = auVar64._4_4_;
  auVar47._8_4_ = auVar64._12_4_;
  auVar47._12_4_ = auVar64._8_4_;
  auVar64 = maxps(auVar47,auVar64);
  auVar107._0_8_ = auVar64._8_8_;
  auVar107._8_4_ = auVar64._0_4_;
  auVar107._12_4_ = auVar64._4_4_;
  auVar64 = maxps(auVar107,auVar64);
  auVar133 = insertps(auVar86,auVar64,0x20);
  auVar48._8_4_ = auVar32._8_4_;
  auVar48._0_8_ = auVar32._0_8_;
  auVar48._12_4_ = auVar32._12_4_;
  auVar64 = blendvps(_DAT_01f45a30,auVar63,auVar48);
  auVar91._4_4_ = auVar64._0_4_;
  auVar91._0_4_ = auVar64._4_4_;
  auVar91._8_4_ = auVar64._12_4_;
  auVar91._12_4_ = auVar64._8_4_;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01f45a40,local_10e8,auVar48);
  auVar86 = minps(auVar91,auVar64);
  auVar49._4_4_ = -(uint)(0.0 <= auVar129._4_4_);
  auVar49._0_4_ = -(uint)(0.0 <= auVar129._0_4_);
  auVar49._8_4_ = -(uint)(0.0 <= auVar129._8_4_);
  auVar49._12_4_ = -(uint)(0.0 <= auVar129._12_4_);
  auVar31 = blendvps(auVar133,auVar129,auVar49);
  auVar108 = blendvps(auVar82,auVar131,auVar49);
  auVar64 = blendvps(auVar131,auVar82,auVar49);
  fVar93 = auVar31._0_4_;
  local_ff8 = auVar31._4_4_;
  local_11c8._4_4_ = bi_9.field_0._0_4_;
  local_11c8._0_4_ = bi_9.field_0._4_4_;
  local_11c8._8_4_ = bi_9.field_0._12_4_;
  local_11c8._12_4_ = bi_9.field_0._8_4_;
  uVar20 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
  local_fb8 = auVar31._8_4_;
  auVar31 = maxps(local_11c8,(undefined1  [16])bi_9.field_0);
  uVar30 = (ulong)(local_fb8 < 0.0) << 4 | 0x40;
  uVar21 = uVar20 ^ 0x10;
  auVar82 = blendvps(auVar129,auVar133,auVar49);
  local_fe8 = auVar108._0_4_ * fVar93;
  local_1008 = auVar108._4_4_ * local_ff8;
  local_fc8 = auVar108._8_4_ * local_fb8;
  local_11e8 = auVar64._0_4_;
  fStack_11e4 = auVar64._4_4_;
  fStack_11e0 = auVar64._8_4_;
  local_1018 = auVar82._0_4_;
  local_1028 = local_11e8 * local_1018;
  local_1038 = auVar82._4_4_;
  fStack_11e4 = fStack_11e4 * local_1038;
  fStack_fa0 = auVar82._8_4_;
  fStack_11e0 = fStack_11e0 * fStack_fa0;
  local_fd8 = fVar93;
  fStack_fd4 = fVar93;
  fStack_fd0 = fVar93;
  fStack_fcc = fVar93;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  local_f98 = blendvps(_DAT_01f45a30,auVar63,local_11d8);
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_11b8 = auVar86._0_4_;
  iStack_11b0 = auVar86._8_4_;
  auVar50._4_4_ = local_11b8;
  auVar50._0_4_ = local_11b8;
  auVar50._8_4_ = local_11b8;
  auVar50._12_4_ = local_11b8;
  auVar66._4_4_ = iStack_11b0;
  auVar66._0_4_ = iStack_11b0;
  auVar66._8_4_ = iStack_11b0;
  auVar66._12_4_ = iStack_11b0;
  auVar64 = minps(auVar66,auVar50);
  uVar25 = auVar31._0_4_;
  uVar132 = auVar31._8_4_;
  auVar51._4_4_ = uVar25;
  auVar51._0_4_ = uVar25;
  auVar51._8_4_ = uVar25;
  auVar51._12_4_ = uVar25;
  auVar67._4_4_ = uVar132;
  auVar67._0_4_ = uVar132;
  auVar67._8_4_ = uVar132;
  auVar67._12_4_ = uVar132;
  auVar82 = maxps(auVar67,auVar51);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1048._4_4_ = fStack_11e4;
  local_1048._0_4_ = fStack_11e4;
  fStack_1040 = fStack_11e4;
  fStack_103c = fStack_11e4;
  local_fa8._4_4_ = fStack_fa0;
  local_fa8._0_4_ = fStack_fa0;
  fStack_f9c = fStack_fa0;
  pSVar29 = stack + 1;
  this = pBVar26;
LAB_00730d38:
  uVar25 = movmskps((int)pBVar18,auVar134);
  do {
    if (pSVar29 == stack) goto LAB_00731122;
    pSVar24 = pSVar29 + -1;
    pSVar22 = pSVar29 + -1;
    pSVar29 = pSVar24;
    if ((pSVar22->mask & ~CONCAT44((int)((ulong)pBVar18 >> 0x20),uVar25)) != 0) {
      sVar28 = 1;
      pSVar22 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)(pSVar24->ptr).ptr;
      do {
        if (((ulong)pSVar22 & 8) != 0) {
          if (sVar28 != 0) {
            pBVar17 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                       *)((ulong)((uint)pSVar22 & 0xf) - 8);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                    *)0x0;
            local_1078 = auVar134;
            pBVar18 = pBVar17;
            auVar92 = auVar134 ^ auVar4;
            goto LAB_00730f78;
          }
          break;
        }
        pSVar24 = pSVar22 + (ulong)(fVar93 < 0.0) + 2;
        fVar98 = *(float *)&(pSVar24->ptr).ptr * local_fd8 - local_fe8;
        fVar115 = *(float *)((long)&(pSVar24->ptr).ptr + 4) * fStack_fd4 - fStack_fe4;
        fVar118 = *(float *)&pSVar24->mask * fStack_fd0 - fStack_fe0;
        fVar58 = *(float *)((long)&pSVar24->mask + 4) * fStack_fcc - fStack_fdc;
        pfVar1 = (float *)((long)&pSVar22[2].ptr.ptr + uVar20);
        fVar60 = *pfVar1 * local_ff8 - local_1008;
        fVar69 = pfVar1[1] * fStack_ff4 - fStack_1004;
        fVar72 = pfVar1[2] * fStack_ff0 - fStack_1000;
        fVar75 = pfVar1[3] * fStack_fec - fStack_ffc;
        uVar61 = (uint)((int)fVar60 < (int)fVar98) * (int)fVar98 |
                 (uint)((int)fVar60 >= (int)fVar98) * (int)fVar60;
        uVar70 = (uint)((int)fVar69 < (int)fVar115) * (int)fVar115 |
                 (uint)((int)fVar69 >= (int)fVar115) * (int)fVar69;
        uVar73 = (uint)((int)fVar72 < (int)fVar118) * (int)fVar118 |
                 (uint)((int)fVar72 >= (int)fVar118) * (int)fVar72;
        uVar76 = (uint)((int)fVar75 < (int)fVar58) * (int)fVar58 |
                 (uint)((int)fVar75 >= (int)fVar58) * (int)fVar75;
        pfVar1 = (float *)((long)&pSVar22[2].ptr.ptr + uVar30);
        fVar98 = *pfVar1 * local_fb8 - local_fc8;
        fVar115 = pfVar1[1] * fStack_fb4 - fStack_fc4;
        fVar118 = pfVar1[2] * fStack_fb0 - fStack_fc0;
        fVar58 = pfVar1[3] * fStack_fac - fStack_fbc;
        local_11b8 = auVar64._0_4_;
        iStack_11b4 = auVar64._4_4_;
        iStack_11b0 = auVar64._8_4_;
        iStack_11ac = auVar64._12_4_;
        uVar15 = (uint)((int)fVar98 < local_11b8) * local_11b8 |
                 (uint)((int)fVar98 >= local_11b8) * (int)fVar98;
        uVar56 = (uint)((int)fVar115 < iStack_11b4) * iStack_11b4 |
                 (uint)((int)fVar115 >= iStack_11b4) * (int)fVar115;
        uVar57 = (uint)((int)fVar118 < iStack_11b0) * iStack_11b0 |
                 (uint)((int)fVar118 >= iStack_11b0) * (int)fVar118;
        uVar59 = (uint)((int)fVar58 < iStack_11ac) * iStack_11ac |
                 (uint)((int)fVar58 >= iStack_11ac) * (int)fVar58;
        pfVar1 = (float *)((long)&pSVar22[2].ptr.ptr + ((ulong)(fVar93 < 0.0) * 0x10 ^ 0x10));
        fVar98 = *pfVar1 * local_1018 - local_1028;
        fVar115 = pfVar1[1] * fStack_1014 - fStack_1024;
        fVar118 = pfVar1[2] * fStack_1010 - fStack_1020;
        fVar58 = pfVar1[3] * fStack_100c - fStack_101c;
        pfVar1 = (float *)((long)&pSVar22[2].ptr.ptr + uVar21);
        fVar60 = *pfVar1 * local_1038 - (float)local_1048._0_4_;
        fVar69 = pfVar1[1] * fStack_1034 - (float)local_1048._4_4_;
        fVar72 = pfVar1[2] * fStack_1030 - fStack_1040;
        fVar75 = pfVar1[3] * fStack_102c - fStack_103c;
        uVar79 = (uint)((int)fVar98 < (int)fVar60) * (int)fVar98 |
                 (uint)((int)fVar98 >= (int)fVar60) * (int)fVar60;
        uVar94 = (uint)((int)fVar115 < (int)fVar69) * (int)fVar115 |
                 (uint)((int)fVar115 >= (int)fVar69) * (int)fVar69;
        uVar96 = (uint)((int)fVar118 < (int)fVar72) * (int)fVar118 |
                 (uint)((int)fVar118 >= (int)fVar72) * (int)fVar72;
        uVar99 = (uint)((int)fVar58 < (int)fVar75) * (int)fVar58 |
                 (uint)((int)fVar58 >= (int)fVar75) * (int)fVar75;
        pfVar1 = (float *)((long)&pSVar22[2].ptr.ptr + (uVar30 ^ 0x10));
        fVar98 = *pfVar1 * (float)local_fa8._0_4_ - fStack_11e0;
        fVar115 = pfVar1[1] * (float)local_fa8._4_4_ - fStack_11e0;
        fVar118 = pfVar1[2] * fStack_fa0 - fStack_11e0;
        fVar58 = pfVar1[3] * fStack_f9c - fStack_11e0;
        local_11c8._0_4_ = auVar82._0_4_;
        local_11c8._4_4_ = auVar82._4_4_;
        local_11c8._8_4_ = auVar82._8_4_;
        local_11c8._12_4_ = auVar82._12_4_;
        uVar62 = (uint)((int)local_11c8._0_4_ < (int)fVar98) * local_11c8._0_4_ |
                 (uint)((int)local_11c8._0_4_ >= (int)fVar98) * (int)fVar98;
        uVar71 = (uint)((int)local_11c8._4_4_ < (int)fVar115) * local_11c8._4_4_ |
                 (uint)((int)local_11c8._4_4_ >= (int)fVar115) * (int)fVar115;
        uVar74 = (uint)((int)local_11c8._8_4_ < (int)fVar118) * local_11c8._8_4_ |
                 (uint)((int)local_11c8._8_4_ >= (int)fVar118) * (int)fVar118;
        uVar77 = (uint)((int)local_11c8._12_4_ < (int)fVar58) * local_11c8._12_4_ |
                 (uint)((int)local_11c8._12_4_ >= (int)fVar58) * (int)fVar58;
        auVar52._4_4_ =
             -(uint)((float)(((int)uVar56 < (int)uVar70) * uVar70 |
                            ((int)uVar56 >= (int)uVar70) * uVar56) <=
                    (float)(((int)uVar94 < (int)uVar71) * uVar94 |
                           ((int)uVar94 >= (int)uVar71) * uVar71));
        auVar52._0_4_ =
             -(uint)((float)(((int)uVar15 < (int)uVar61) * uVar61 |
                            ((int)uVar15 >= (int)uVar61) * uVar15) <=
                    (float)(((int)uVar79 < (int)uVar62) * uVar79 |
                           ((int)uVar79 >= (int)uVar62) * uVar62));
        auVar52._8_4_ =
             -(uint)((float)(((int)uVar57 < (int)uVar73) * uVar73 |
                            ((int)uVar57 >= (int)uVar73) * uVar57) <=
                    (float)(((int)uVar96 < (int)uVar74) * uVar96 |
                           ((int)uVar96 >= (int)uVar74) * uVar74));
        auVar52._12_4_ =
             -(uint)((float)(((int)uVar59 < (int)uVar76) * uVar76 |
                            ((int)uVar59 >= (int)uVar76) * uVar59) <=
                    (float)(((int)uVar99 < (int)uVar77) * uVar99 |
                           ((int)uVar99 >= (int)uVar77) * uVar77));
        uVar15 = movmskps((int)uVar21,auVar52);
        if (uVar15 == 0) break;
        uVar27 = (ulong)(uVar15 & 0xff);
        sVar28 = 0;
        pSVar23 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x8;
        do {
          lVar3 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          fVar98 = *(float *)((long)&pSVar22[2].ptr.ptr + lVar3 * 4);
          fVar115 = *(float *)((long)&pSVar22[3].ptr.ptr + lVar3 * 4);
          fVar118 = *(float *)((long)&pSVar22[4].ptr.ptr + lVar3 * 4);
          fVar58 = *(float *)((long)&pSVar22[5].ptr.ptr + lVar3 * 4);
          fVar80 = (fVar98 - fVar135) * fVar147;
          fVar95 = (fVar98 - fVar136) * fVar148;
          fVar97 = (fVar98 - fVar137) * fVar149;
          fVar100 = (fVar98 - fVar138) * fVar150;
          fVar101 = (fVar118 - fVar139) * auVar127._0_4_;
          fVar109 = (fVar118 - fVar140) * auVar127._4_4_;
          fVar110 = (fVar118 - fVar141) * auVar127._8_4_;
          fVar111 = (fVar118 - fVar142) * auVar127._12_4_;
          fVar98 = *(float *)((long)&pSVar22[6].ptr.ptr + lVar3 * 4);
          fVar112 = (fVar98 - fVar143) * fVar120;
          fVar116 = (fVar98 - fVar144) * fVar122;
          fVar117 = (fVar98 - fVar145) * fVar124;
          fVar119 = (fVar98 - fVar146) * fVar126;
          fVar69 = (fVar115 - fVar135) * fVar147;
          fVar72 = (fVar115 - fVar136) * fVar148;
          fVar75 = (fVar115 - fVar137) * fVar149;
          fVar78 = (fVar115 - fVar138) * fVar150;
          fVar115 = (fVar58 - fVar139) * auVar127._0_4_;
          fVar118 = (fVar58 - fVar140) * auVar127._4_4_;
          fVar60 = (fVar58 - fVar141) * auVar127._8_4_;
          fVar58 = (fVar58 - fVar142) * auVar127._12_4_;
          fVar98 = *(float *)((long)&pSVar22[7].ptr.ptr + lVar3 * 4);
          fVar121 = (fVar98 - fVar143) * fVar120;
          fVar123 = (fVar98 - fVar144) * fVar122;
          fVar125 = (fVar98 - fVar145) * fVar124;
          fVar98 = (fVar98 - fVar146) * fVar126;
          uVar15 = (uint)((int)fVar69 < (int)fVar80) * (int)fVar69 |
                   (uint)((int)fVar69 >= (int)fVar80) * (int)fVar80;
          uVar56 = (uint)((int)fVar72 < (int)fVar95) * (int)fVar72 |
                   (uint)((int)fVar72 >= (int)fVar95) * (int)fVar95;
          uVar57 = (uint)((int)fVar75 < (int)fVar97) * (int)fVar75 |
                   (uint)((int)fVar75 >= (int)fVar97) * (int)fVar97;
          uVar59 = (uint)((int)fVar78 < (int)fVar100) * (int)fVar78 |
                   (uint)((int)fVar78 >= (int)fVar100) * (int)fVar100;
          uVar61 = (uint)((int)fVar115 < (int)fVar101) * (int)fVar115 |
                   (uint)((int)fVar115 >= (int)fVar101) * (int)fVar101;
          uVar62 = (uint)((int)fVar118 < (int)fVar109) * (int)fVar118 |
                   (uint)((int)fVar118 >= (int)fVar109) * (int)fVar109;
          uVar70 = (uint)((int)fVar60 < (int)fVar110) * (int)fVar60 |
                   (uint)((int)fVar60 >= (int)fVar110) * (int)fVar110;
          uVar71 = (uint)((int)fVar58 < (int)fVar111) * (int)fVar58 |
                   (uint)((int)fVar58 >= (int)fVar111) * (int)fVar111;
          uVar79 = ((int)uVar61 < (int)uVar15) * uVar15 | ((int)uVar61 >= (int)uVar15) * uVar61;
          uVar94 = ((int)uVar62 < (int)uVar56) * uVar56 | ((int)uVar62 >= (int)uVar56) * uVar62;
          uVar96 = ((int)uVar70 < (int)uVar57) * uVar57 | ((int)uVar70 >= (int)uVar57) * uVar70;
          uVar99 = ((int)uVar71 < (int)uVar59) * uVar59 | ((int)uVar71 >= (int)uVar59) * uVar71;
          uVar15 = (uint)((int)fVar121 < (int)fVar112) * (int)fVar121 |
                   (uint)((int)fVar121 >= (int)fVar112) * (int)fVar112;
          uVar56 = (uint)((int)fVar123 < (int)fVar116) * (int)fVar123 |
                   (uint)((int)fVar123 >= (int)fVar116) * (int)fVar116;
          uVar57 = (uint)((int)fVar125 < (int)fVar117) * (int)fVar125 |
                   (uint)((int)fVar125 >= (int)fVar117) * (int)fVar117;
          uVar59 = (uint)((int)fVar98 < (int)fVar119) * (int)fVar98 |
                   (uint)((int)fVar98 >= (int)fVar119) * (int)fVar119;
          uVar73 = (uint)((int)uVar15 < (int)local_f98._0_4_) * local_f98._0_4_ |
                   ((int)uVar15 >= (int)local_f98._0_4_) * uVar15;
          uVar74 = (uint)((int)uVar56 < (int)local_f98._4_4_) * local_f98._4_4_ |
                   ((int)uVar56 >= (int)local_f98._4_4_) * uVar56;
          uVar76 = (uint)((int)uVar57 < (int)local_f98._8_4_) * local_f98._8_4_ |
                   ((int)uVar57 >= (int)local_f98._8_4_) * uVar57;
          uVar77 = (uint)((int)uVar59 < (int)local_f98._12_4_) * local_f98._12_4_ |
                   ((int)uVar59 >= (int)local_f98._12_4_) * uVar59;
          uVar61 = (uint)((int)fVar69 < (int)fVar80) * (int)fVar80 |
                   (uint)((int)fVar69 >= (int)fVar80) * (int)fVar69;
          uVar62 = (uint)((int)fVar72 < (int)fVar95) * (int)fVar95 |
                   (uint)((int)fVar72 >= (int)fVar95) * (int)fVar72;
          uVar70 = (uint)((int)fVar75 < (int)fVar97) * (int)fVar97 |
                   (uint)((int)fVar75 >= (int)fVar97) * (int)fVar75;
          uVar71 = (uint)((int)fVar78 < (int)fVar100) * (int)fVar100 |
                   (uint)((int)fVar78 >= (int)fVar100) * (int)fVar78;
          uVar15 = (uint)((int)fVar115 < (int)fVar101) * (int)fVar101 |
                   (uint)((int)fVar115 >= (int)fVar101) * (int)fVar115;
          uVar56 = (uint)((int)fVar118 < (int)fVar109) * (int)fVar109 |
                   (uint)((int)fVar118 >= (int)fVar109) * (int)fVar118;
          uVar57 = (uint)((int)fVar60 < (int)fVar110) * (int)fVar110 |
                   (uint)((int)fVar60 >= (int)fVar110) * (int)fVar60;
          uVar59 = (uint)((int)fVar58 < (int)fVar111) * (int)fVar111 |
                   (uint)((int)fVar58 >= (int)fVar111) * (int)fVar58;
          uVar15 = ((int)uVar61 < (int)uVar15) * uVar61 | ((int)uVar61 >= (int)uVar15) * uVar15;
          uVar56 = ((int)uVar62 < (int)uVar56) * uVar62 | ((int)uVar62 >= (int)uVar56) * uVar56;
          uVar57 = ((int)uVar70 < (int)uVar57) * uVar70 | ((int)uVar70 >= (int)uVar57) * uVar57;
          uVar59 = ((int)uVar71 < (int)uVar59) * uVar71 | ((int)uVar71 >= (int)uVar59) * uVar59;
          uVar61 = (uint)((int)fVar121 < (int)fVar112) * (int)fVar112 |
                   (uint)((int)fVar121 >= (int)fVar112) * (int)fVar121;
          uVar62 = (uint)((int)fVar123 < (int)fVar116) * (int)fVar116 |
                   (uint)((int)fVar123 >= (int)fVar116) * (int)fVar123;
          uVar70 = (uint)((int)fVar125 < (int)fVar117) * (int)fVar117 |
                   (uint)((int)fVar125 >= (int)fVar117) * (int)fVar125;
          uVar71 = (uint)((int)fVar98 < (int)fVar119) * (int)fVar119 |
                   (uint)((int)fVar98 >= (int)fVar119) * (int)fVar98;
          uVar61 = (uint)(bi_9.field_0.i[0] < (int)uVar61) * bi_9.field_0.i[0] |
                   (bi_9.field_0.i[0] >= (int)uVar61) * uVar61;
          uVar62 = (uint)(bi_9.field_0.i[1] < (int)uVar62) * bi_9.field_0.i[1] |
                   (bi_9.field_0.i[1] >= (int)uVar62) * uVar62;
          uVar70 = (uint)(bi_9.field_0.i[2] < (int)uVar70) * bi_9.field_0.i[2] |
                   (bi_9.field_0.i[2] >= (int)uVar70) * uVar70;
          uVar71 = (uint)(bi_9.field_0.i[3] < (int)uVar71) * bi_9.field_0.i[3] |
                   (bi_9.field_0.i[3] >= (int)uVar71) * uVar71;
          auVar130._4_4_ =
               -(uint)((float)(((int)uVar74 < (int)uVar94) * uVar94 |
                              ((int)uVar74 >= (int)uVar94) * uVar74) <=
                      (float)(((int)uVar56 < (int)uVar62) * uVar56 |
                             ((int)uVar56 >= (int)uVar62) * uVar62));
          auVar130._0_4_ =
               -(uint)((float)(((int)uVar73 < (int)uVar79) * uVar79 |
                              ((int)uVar73 >= (int)uVar79) * uVar73) <=
                      (float)(((int)uVar15 < (int)uVar61) * uVar15 |
                             ((int)uVar15 >= (int)uVar61) * uVar61));
          auVar130._8_4_ =
               -(uint)((float)(((int)uVar76 < (int)uVar96) * uVar96 |
                              ((int)uVar76 >= (int)uVar96) * uVar76) <=
                      (float)(((int)uVar57 < (int)uVar70) * uVar57 |
                             ((int)uVar57 >= (int)uVar70) * uVar70));
          auVar130._12_4_ =
               -(uint)((float)(((int)uVar77 < (int)uVar99) * uVar99 |
                              ((int)uVar77 >= (int)uVar99) * uVar77) <=
                      (float)(((int)uVar59 < (int)uVar71) * uVar59 |
                             ((int)uVar59 >= (int)uVar71) * uVar71));
          uVar15 = movmskps((int)context,auVar130);
          context = (RayQueryContext *)(ulong)uVar15;
          pSVar24 = pSVar23;
          if (uVar15 != 0) {
            pSVar24 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)(&pSVar22->ptr)[lVar3].ptr;
            if (pSVar23 != (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x8) {
              (pSVar29->ptr).ptr = (size_t)pSVar23;
              pSVar29->mask = sVar28;
              pSVar29 = pSVar29 + 1;
            }
            sVar28 = (size_t)(byte)uVar15;
          }
          this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                  *)(uVar27 - 1);
          uVar27 = uVar27 & (ulong)this;
          pSVar23 = pSVar24;
        } while (uVar27 != 0);
        pSVar22 = pSVar24;
      } while (pSVar24 != (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x8);
    }
  } while( true );
  while( true ) {
    local_1114 = *(uint *)(((ulong)pSVar22 & 0xfffffffffffffff0) + (long)this * 8);
    context = (RayQueryContext *)(ulong)local_1114;
    local_1110 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (long)context * 8);
    uVar15 = *(uint *)(local_1110 + 0x34);
    auVar68._0_4_ = -(uint)((uVar15 & *(uint *)&(This->intersector8).occluded) == 0);
    auVar68._4_4_ = -(uint)((uVar15 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
    auVar68._8_4_ = -(uint)((uVar15 & *(uint *)&(This->intersector8).name) == 0);
    auVar68._12_4_ = -(uint)((uVar15 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar68 & auVar53);
    uVar61 = movmskps((int)pSVar24,(undefined1  [16])mask.field_0);
    pSVar24 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)(ulong)uVar61;
    local_1058 = auVar53;
    uVar15 = local_1068;
    uVar56 = uStack_1064;
    uVar57 = uStack_1060;
    uVar59 = uStack_105c;
    if (uVar61 != 0) {
      local_1130 = *(undefined4 *)(((ulong)pSVar22 & 0xfffffffffffffff0) + 4 + (long)this * 8);
      local_1140 = &mask;
      local_1138 = *(undefined8 *)(local_1110 + 0x18);
      pSVar24 = *(StackItemMaskT<embree::NodeRefPtr<4>_> **)(ray + 8);
      local_1118 = 4;
      local_1108 = 0;
      local_1100 = *(long *)(ray + 0x10);
      pcVar19 = *(code **)(local_1100 + 0x18);
      if (pcVar19 == (code *)0x0) {
        pcVar19 = *(code **)(local_1110 + 0x68);
      }
      local_1128 = pSVar24;
      local_1120 = This;
      local_1110 = (*pcVar19)(&local_1140);
      uVar15 = -(uint)(*(float *)&(This->intersector4_nofilter).name < 0.0);
      uVar56 = -(uint)(*(float *)((long)&(This->intersector4_nofilter).name + 4) < 0.0);
      uVar57 = -(uint)(*(float *)&(This->intersector8).intersect < 0.0);
      uVar59 = -(uint)(*(float *)((long)&(This->intersector8).intersect + 4) < 0.0);
      auVar127 = local_10d8;
      auVar134 = local_1078;
      fVar135 = local_1088;
      fVar136 = fStack_1084;
      fVar137 = fStack_1080;
      fVar138 = fStack_107c;
      fVar139 = local_1098;
      fVar140 = fStack_1094;
      fVar141 = fStack_1090;
      fVar142 = fStack_108c;
      fVar143 = local_10a8;
      fVar144 = fStack_10a4;
      fVar145 = fStack_10a0;
      fVar146 = fStack_109c;
      fVar120 = local_10b8;
      fVar122 = fStack_10b4;
      fVar124 = fStack_10b0;
      fVar126 = fStack_10ac;
      fVar147 = local_10c8;
      fVar148 = fStack_10c4;
      fVar149 = fStack_10c0;
      fVar150 = fStack_10bc;
    }
    auVar53._0_8_ = CONCAT44(~uVar56 & local_1058._4_4_,~uVar15 & local_1058._0_4_);
    auVar53._8_4_ = ~uVar57 & local_1058._8_4_;
    auVar53._12_4_ = ~uVar59 & local_1058._12_4_;
    iVar16 = movmskps((int)local_1110,auVar53);
    pBVar18 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
               *)CONCAT44((int)((ulong)local_1110 >> 0x20),iVar16);
    this = this + 1;
    auVar92._8_4_ = auVar53._8_4_;
    auVar92._0_8_ = auVar53._0_8_;
    auVar92._12_4_ = auVar53._12_4_;
    if (iVar16 == 0) break;
LAB_00730f78:
    auVar53 = auVar92;
    if (pBVar17 == this) break;
  }
  auVar54._0_8_ = auVar53._0_8_ ^ 0xffffffffffffffff;
  auVar54._8_4_ = auVar53._8_4_ ^ 0xffffffff;
  auVar54._12_4_ = auVar53._12_4_ ^ 0xffffffff;
  auVar134 = auVar134 | auVar54;
  local_11d8._0_4_ = ~auVar134._0_4_ & local_11d8._0_4_;
  local_11d8._4_4_ = ~auVar134._4_4_ & local_11d8._4_4_;
  local_11d8._8_4_ = ~auVar134._8_4_ & local_11d8._8_4_;
  local_11d8._12_4_ = ~auVar134._12_4_ & local_11d8._12_4_;
  iVar16 = movmskps((int)pBVar18,local_11d8);
  pBVar18 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
             *)CONCAT44((int)((ulong)pBVar18 >> 0x20),iVar16);
  if (iVar16 == 0) goto LAB_00731122;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps((undefined1  [16])bi_9.field_0,_DAT_01f45a40,auVar134);
  goto LAB_00730d38;
LAB_00731122:
  pBVar18 = pBVar26;
  if (pBVar26 ==
      (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
       *)0x0) {
    auVar55._0_4_ = -(uint)(local_10f8 == -1);
    auVar55._4_4_ = -(uint)(iStack_10f4 == -1);
    auVar55._8_4_ = -(uint)(iStack_10f0 == -1);
    auVar55._12_4_ = -(uint)(iStack_10ec == -1);
    auVar134 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f45a40,
                        auVar55 & auVar134);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar134;
    return;
  }
  goto LAB_0073094a;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }